

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

CURLcode Curl_is_connected(connectdata *conn,int sockindex,_Bool *connected)

{
  undefined8 uVar1;
  int iVar2;
  _Bool _Var3;
  uint uVar4;
  CURLcode CVar5;
  CURLcode CVar6;
  CURLcode CVar7;
  long lVar8;
  int *piVar9;
  char *pcVar10;
  ulong uVar11;
  Curl_easy *pCVar12;
  uint uVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  int error;
  char ipaddress [46];
  int local_a8;
  CURLcode local_a4;
  int local_a0;
  CURLcode local_9c;
  long local_98;
  timeval local_90;
  _Bool *local_80;
  Curl_easy *local_78;
  ulong local_70;
  char local_68 [56];
  
  pCVar12 = conn->data;
  local_a8 = 0;
  *connected = false;
  local_98 = (long)sockindex;
  if ((conn->bits).tcpconnect[local_98] == true) {
    *connected = true;
    CVar5 = CURLE_OK;
  }
  else {
    local_90 = curlx_tvnow();
    local_70 = Curl_timeleft(pCVar12,&local_90,true);
    if ((long)local_70 < 0) {
      Curl_failf(pCVar12,"Connection time-out");
      CVar5 = CURLE_OPERATION_TIMEDOUT;
    }
    else {
      lVar14 = -1;
      local_a4 = CURLE_OK;
      local_a0 = sockindex;
      local_80 = connected;
      local_78 = pCVar12;
      do {
        if (conn->tempsock[lVar14 + 1] == -1) {
          iVar16 = 6;
          CVar5 = local_a4;
          CVar7 = local_9c;
        }
        else {
          uVar13 = (int)lVar14 + 1U ^ 1;
          uVar4 = Curl_socket_check(-1,-1,conn->tempsock[lVar14 + 1],0);
          if (uVar4 == 2) {
LAB_00132962:
            _Var3 = verifyconnect(conn->tempsock[lVar14 + 1],&local_a8);
            if (_Var3) {
              conn->sock[local_98] = conn->tempsock[lVar14 + 1];
              conn->ip_addr = conn->tempaddr[lVar14 + 1];
              conn->tempsock[lVar14 + 1] = -1;
              if (conn->tempsock[uVar13] != -1) {
                Curl_closesocket(conn,conn->tempsock[uVar13]);
                conn->tempsock[uVar13] = -1;
              }
              iVar2 = local_a0;
              CVar5 = Curl_connected_proxy(conn,local_a0);
              iVar16 = 1;
              CVar7 = CVar5;
              if (CVar5 == CURLE_OK) {
                (conn->bits).tcpconnect[local_98] = true;
                *local_80 = true;
                if (iVar2 == 0) {
                  Curl_pgrsTime(pCVar12,TIMER_CONNECT);
                }
                Curl_updateconninfo(conn,conn->sock[local_98]);
                Curl_verboseconnect(conn);
                local_a4 = CURLE_OK;
                local_9c = CURLE_OK;
                CVar5 = local_a4;
                CVar7 = local_9c;
              }
              goto LAB_00132b1f;
            }
            Curl_infof(pCVar12,"Connection failed\n");
          }
          else if (uVar4 == 0) {
            local_a8 = 0;
            lVar8 = curlx_tvdiff(local_90,conn->connecttime);
            if (conn->timeoutms_per_addr <= lVar8) {
              Curl_infof(pCVar12,"After %ldms connect time, move on!\n");
              local_a8 = 0x6e;
            }
            if (((lVar14 == -1) && (conn->tempaddr[1] == (Curl_addrinfo *)0x0)) &&
               (lVar8 = curlx_tvdiff(local_90,conn->connecttime), 199 < lVar8)) {
              trynextip(conn,local_a0,1);
            }
          }
          else {
            if ((conn->bits).tcp_fastopen == true) goto LAB_00132962;
            if ((uVar4 & 4) != 0) {
              verifyconnect(conn->tempsock[lVar14 + 1],&local_a8);
            }
          }
          iVar2 = local_a8;
          iVar15 = 0;
          iVar16 = 0;
          CVar5 = local_a4;
          CVar7 = local_9c;
          if (local_a8 != 0) {
            (pCVar12->state).os_errno = local_a8;
            piVar9 = __errno_location();
            *piVar9 = iVar2;
            iVar16 = iVar15;
            CVar5 = local_a4;
            CVar7 = local_9c;
            if (conn->tempaddr[lVar14 + 1] != (Curl_addrinfo *)0x0) {
              Curl_printable_address(conn->tempaddr[lVar14 + 1],local_68,0x2e);
              lVar8 = conn->port;
              pcVar10 = Curl_strerror(conn,local_a8);
              Curl_infof(pCVar12,"connect to %s port %ld failed: %s\n",local_68,lVar8,pcVar10);
              conn->timeoutms_per_addr =
                   local_70 >> (conn->tempaddr[lVar14 + 1]->ai_next != (Curl_addrinfo *)0x0);
              CVar6 = trynextip(conn,local_a0,(int)lVar14 + 1);
              pCVar12 = local_78;
              CVar7 = local_9c;
              if ((CVar6 != CURLE_COULDNT_CONNECT) ||
                 (CVar5 = local_a4, conn->tempsock[uVar13] == -1)) {
                CVar5 = CVar6;
              }
            }
          }
        }
LAB_00132b1f:
        local_9c = CVar7;
        local_a4 = CVar5;
        if ((iVar16 != 6) && (iVar16 != 0)) {
          return local_9c;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 == 0);
      CVar5 = CURLE_OK;
      if ((local_a4 != CURLE_OK) &&
         ((CVar7 = local_a4, conn->tempaddr[1] != (Curl_addrinfo *)0x0 ||
          (CVar7 = trynextip(conn,local_a0,1), CVar5 = CURLE_OK, CVar7 != CURLE_OK)))) {
        CVar5 = CVar7;
        uVar11 = 0x100;
        if ((conn->bits).proxy == false) {
          uVar11 = (ulong)(conn->bits).conn_to_host << 5 | 0xc0;
        }
        uVar1 = *(undefined8 *)((conn->chunk).hexbuffer + (uVar11 - 8));
        lVar14 = conn->port;
        pcVar10 = Curl_strerror(conn,local_a8);
        Curl_failf(pCVar12,"Failed to connect to %s port %ld: %s",uVar1,lVar14,pcVar10);
      }
    }
  }
  return CVar5;
}

Assistant:

CURLcode Curl_is_connected(struct connectdata *conn,
                           int sockindex,
                           bool *connected)
{
  struct Curl_easy *data = conn->data;
  CURLcode result = CURLE_OK;
  long allow;
  int error = 0;
  struct timeval now;
  int rc;
  int i;

  DEBUGASSERT(sockindex >= FIRSTSOCKET && sockindex <= SECONDARYSOCKET);

  *connected = FALSE; /* a very negative world view is best */

  if(conn->bits.tcpconnect[sockindex]) {
    /* we are connected already! */
    *connected = TRUE;
    return CURLE_OK;
  }

  now = Curl_tvnow();

  /* figure out how long time we have left to connect */
  allow = Curl_timeleft(data, &now, TRUE);

  if(allow < 0) {
    /* time-out, bail out, go home */
    failf(data, "Connection time-out");
    return CURLE_OPERATION_TIMEDOUT;
  }

  for(i=0; i<2; i++) {
    const int other = i ^ 1;
    if(conn->tempsock[i] == CURL_SOCKET_BAD)
      continue;

#ifdef mpeix
    /* Call this function once now, and ignore the results. We do this to
       "clear" the error state on the socket so that we can later read it
       reliably. This is reported necessary on the MPE/iX operating system. */
    (void)verifyconnect(conn->tempsock[i], NULL);
#endif

    /* check socket for connect */
    rc = Curl_socket_ready(CURL_SOCKET_BAD, conn->tempsock[i], 0);

    if(rc == 0) { /* no connection yet */
      error = 0;
      if(curlx_tvdiff(now, conn->connecttime) >= conn->timeoutms_per_addr) {
        infof(data, "After %ldms connect time, move on!\n",
              conn->timeoutms_per_addr);
        error = ETIMEDOUT;
      }

      /* should we try another protocol family? */
      if(i == 0 && conn->tempaddr[1] == NULL &&
         curlx_tvdiff(now, conn->connecttime) >= HAPPY_EYEBALLS_TIMEOUT) {
        trynextip(conn, sockindex, 1);
      }
    }
    else if(rc == CURL_CSELECT_OUT || conn->bits.tcp_fastopen) {
      if(verifyconnect(conn->tempsock[i], &error)) {
        /* we are connected with TCP, awesome! */

        /* use this socket from now on */
        conn->sock[sockindex] = conn->tempsock[i];
        conn->ip_addr = conn->tempaddr[i];
        conn->tempsock[i] = CURL_SOCKET_BAD;

        /* close the other socket, if open */
        if(conn->tempsock[other] != CURL_SOCKET_BAD) {
          Curl_closesocket(conn, conn->tempsock[other]);
          conn->tempsock[other] = CURL_SOCKET_BAD;
        }

        /* see if we need to do any proxy magic first once we connected */
        result = Curl_connected_proxy(conn, sockindex);
        if(result)
          return result;

        conn->bits.tcpconnect[sockindex] = TRUE;

        *connected = TRUE;
        if(sockindex == FIRSTSOCKET)
          Curl_pgrsTime(data, TIMER_CONNECT); /* connect done */
        Curl_updateconninfo(conn, conn->sock[sockindex]);
        Curl_verboseconnect(conn);

        return CURLE_OK;
      }
      else
        infof(data, "Connection failed\n");
    }
    else if(rc & CURL_CSELECT_ERR)
      (void)verifyconnect(conn->tempsock[i], &error);

    /*
     * The connection failed here, we should attempt to connect to the "next
     * address" for the given host. But first remember the latest error.
     */
    if(error) {
      data->state.os_errno = error;
      SET_SOCKERRNO(error);
      if(conn->tempaddr[i]) {
        CURLcode status;
        char ipaddress[MAX_IPADR_LEN];
        Curl_printable_address(conn->tempaddr[i], ipaddress, MAX_IPADR_LEN);
        infof(data, "connect to %s port %ld failed: %s\n",
              ipaddress, conn->port, Curl_strerror(conn, error));

        conn->timeoutms_per_addr = conn->tempaddr[i]->ai_next == NULL ?
                                   allow : allow / 2;

        status = trynextip(conn, sockindex, i);
        if(status != CURLE_COULDNT_CONNECT
            || conn->tempsock[other] == CURL_SOCKET_BAD)
          /* the last attempt failed and no other sockets remain open */
          result = status;
      }
    }
  }

  if(result) {
    /* no more addresses to try */

    const char* hostname;

    /* if the first address family runs out of addresses to try before
       the happy eyeball timeout, go ahead and try the next family now */
    if(conn->tempaddr[1] == NULL) {
      result = trynextip(conn, sockindex, 1);
      if(!result)
        return result;
    }

    if(conn->bits.proxy)
      hostname = conn->proxy.name;
    else if(conn->bits.conn_to_host)
      hostname = conn->conn_to_host.name;
    else
      hostname = conn->host.name;

    failf(data, "Failed to connect to %s port %ld: %s",
        hostname, conn->port, Curl_strerror(conn, error));
  }

  return result;
}